

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZAnalyticSolution.cpp
# Opt level: O1

FADFADSTATE * FADcos(FADFADSTATE *__return_storage_ptr__,FADFADSTATE *x)

{
  uint sz;
  double dVar1;
  double *pdVar2;
  long lVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  FADFADSTATE *cosa;
  Fad<double> cosaval;
  Fad<double> sinaval;
  Fad<double> local_d0;
  Fad<double> local_b0;
  FadExpr<FadFuncSin<Fad<double>_>_> local_90;
  undefined1 local_68 [32];
  double local_48;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  FadExpr<FadUnaryMin<Fad<double>_>_> local_38;
  
  FadFuncSin<Fad<double>_>::FadFuncSin((FadFuncSin<Fad<double>_> *)local_68,&x->val_);
  FadExpr<FadFuncSin<Fad<double>_>_>::FadExpr(&local_90,(FadFuncSin<Fad<double>_> *)local_68);
  Fad<double>::~Fad((Fad<double> *)local_68);
  local_b0.val_ = sin(local_90.fadexpr_.expr_.val_);
  iVar4 = local_90.fadexpr_.expr_.dx_.num_elts;
  local_b0.dx_.num_elts = 0;
  local_b0.dx_.ptr_to_data = (double *)0x0;
  if ((long)local_90.fadexpr_.expr_.dx_.num_elts < 1) {
    local_b0.defaultVal = 0.0;
  }
  else {
    local_b0.dx_.num_elts = local_90.fadexpr_.expr_.dx_.num_elts;
    uVar5 = (long)local_90.fadexpr_.expr_.dx_.num_elts << 3;
    local_b0.dx_.ptr_to_data = (double *)operator_new__(uVar5);
    local_b0.defaultVal = 0.0;
    if (0 < iVar4) {
      uVar6 = 0;
      do {
        pdVar2 = (double *)((long)local_90.fadexpr_.expr_.dx_.ptr_to_data + uVar6);
        if (local_90.fadexpr_.expr_.dx_.num_elts == 0) {
          pdVar2 = &local_90.fadexpr_.expr_.defaultVal;
        }
        local_48 = *pdVar2;
        dVar1 = cos(local_90.fadexpr_.expr_.val_);
        *(double *)((long)local_b0.dx_.ptr_to_data + uVar6) = dVar1 * local_48;
        uVar6 = uVar6 + 8;
      } while (uVar5 != uVar6);
    }
  }
  Fad<double>::~Fad(&local_90.fadexpr_.expr_);
  FadFuncCos<Fad<double>_>::FadFuncCos((FadFuncCos<Fad<double>_> *)local_68,&x->val_);
  FadExpr<FadFuncCos<Fad<double>_>_>::FadExpr
            ((FadExpr<FadFuncCos<Fad<double>_>_> *)&local_90,(FadFuncCos<Fad<double>_> *)local_68);
  Fad<double>::~Fad((Fad<double> *)local_68);
  local_d0.val_ = cos(local_90.fadexpr_.expr_.val_);
  iVar4 = local_90.fadexpr_.expr_.dx_.num_elts;
  local_d0.dx_.num_elts = 0;
  local_d0.dx_.ptr_to_data = (double *)0x0;
  if ((long)local_90.fadexpr_.expr_.dx_.num_elts < 1) {
    local_d0.defaultVal = 0.0;
  }
  else {
    local_d0.dx_.num_elts = local_90.fadexpr_.expr_.dx_.num_elts;
    uVar5 = (long)local_90.fadexpr_.expr_.dx_.num_elts << 3;
    local_d0.dx_.ptr_to_data = (double *)operator_new__(uVar5);
    local_d0.defaultVal = 0.0;
    if (0 < iVar4) {
      uVar6 = 0;
      do {
        pdVar2 = (double *)((long)local_90.fadexpr_.expr_.dx_.ptr_to_data + uVar6);
        if (local_90.fadexpr_.expr_.dx_.num_elts == 0) {
          pdVar2 = &local_90.fadexpr_.expr_.defaultVal;
        }
        local_48 = -*pdVar2;
        uStack_40 = 0;
        uStack_3c = 0x80000000;
        dVar1 = sin(local_90.fadexpr_.expr_.val_);
        *(double *)((long)local_d0.dx_.ptr_to_data + uVar6) = dVar1 * local_48;
        uVar6 = uVar6 + 8;
      } while (uVar5 != uVar6);
    }
  }
  Fad<double>::~Fad(&local_90.fadexpr_.expr_);
  sz = (x->dx_).num_elts;
  Fad<Fad<double>_>::Fad(__return_storage_ptr__,sz,&local_d0);
  if (0 < (int)sz) {
    lVar3 = 0;
    iVar4 = 0;
    do {
      local_38.fadexpr_.expr_ = (FadUnaryMin<Fad<double>_>)&local_b0;
      Fad<Fad<double>_>::dx((Fad<double> *)&local_90,x,iVar4);
      local_68._0_8_ = &local_38;
      local_68._8_8_ = (Fad<double> *)&local_90;
      Fad<double>::operator=
                ((Fad<double> *)((long)&((__return_storage_ptr__->dx_).ptr_to_data)->val_ + lVar3),
                 (FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_Fad<double>_>_> *)
                 local_68);
      Fad<double>::~Fad((Fad<double> *)&local_90);
      iVar4 = iVar4 + 1;
      lVar3 = lVar3 + 0x20;
    } while ((ulong)sz << 5 != lVar3);
  }
  Fad<double>::~Fad(&local_d0);
  Fad<double>::~Fad(&local_b0);
  return __return_storage_ptr__;
}

Assistant:

static FADFADSTATE FADcos(FADFADSTATE x)
{
    Fad<STATE> sinaval = sin(x.val());
    Fad<STATE> cosaval = cos(x.val());
    int sz = x.size();
    FADFADSTATE cosa(sz,cosaval);
    for (int i=0; i<sz; i++) {
        cosa.fastAccessDx(i) = -sinaval*x.dx(i);
    }
    return cosa;
}